

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void duckdb::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::AssertIndexInBounds
               (idx_t index,idx_t size)

{
  undefined8 uVar1;
  string *in_RSI;
  string *in_RDI;
  InternalException *unaff_retaddr;
  allocator local_31;
  string local_30 [24];
  unsigned_long in_stack_ffffffffffffffe8;
  
  if (in_RSI <= in_RDI) {
    uVar1 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_30,"Attempted to access index %ld within vector of size %ld",&local_31);
    InternalException::InternalException<unsigned_long,unsigned_long>
              (unaff_retaddr,in_RDI,(unsigned_long)in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

static inline void AssertIndexInBounds(idx_t index, idx_t size) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(index >= size)) {
			throw InternalException("Attempted to access index %ld within vector of size %ld", index, size);
		}
#endif
	}